

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_chr.c
# Opt level: O2

uint byte_chr(char *s,uint n,int c)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  char *t;
  
  iVar6 = (int)s;
  cVar5 = (char)c;
  lVar4 = 0;
  pcVar2 = s;
  do {
    iVar1 = (int)pcVar2;
    uVar3 = (uint)lVar4;
    if (n == uVar3) {
LAB_00105ba6:
      return iVar1 - iVar6;
    }
    if (cVar5 == s[lVar4]) {
      iVar1 = uVar3 + iVar6;
      goto LAB_00105ba6;
    }
    if (n - 1 == uVar3) {
      iVar1 = iVar6 + uVar3 + 1;
      goto LAB_00105ba6;
    }
    if (cVar5 == s[lVar4 + 1]) {
      iVar1 = iVar1 + 1;
      goto LAB_00105ba6;
    }
    if (n - 2 == uVar3) {
      iVar1 = iVar6 + uVar3 + 2;
      goto LAB_00105ba6;
    }
    if (cVar5 == s[lVar4 + 2]) {
      iVar1 = iVar1 + 2;
      goto LAB_00105ba6;
    }
    if (n - 3 == uVar3) {
      iVar1 = iVar1 + 3;
      goto LAB_00105ba6;
    }
    if (cVar5 == s[lVar4 + 3]) {
      iVar1 = iVar6 + uVar3 + 3;
      goto LAB_00105ba6;
    }
    pcVar2 = pcVar2 + 4;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

unsigned int byte_chr(s,n,c)
char *s;
register unsigned int n;
int c;
{
  register char ch;
  register char *t;

  ch = c;
  t = s;
  for (;;) {
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
  }
  return t - s;
}